

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubD::ClearEdgeSharpness(ON_SubD *this)

{
  bool bVar1;
  ON_SubDEdge *this_00;
  uint uVar2;
  ON_SubDEdgeIterator eit;
  
  ON_SubDEdgeIterator::ON_SubDEdgeIterator(&eit,this);
  eit.m_edge_index = 0;
  eit.m_e_current = eit.m_e_first;
  uVar2 = 0;
  this_00 = eit.m_e_first;
  while (this_00 != (ON_SubDEdge *)0x0) {
    bVar1 = ON_SubDEdge::ClearSharpnessForExperts(this_00);
    if (bVar1) {
      ON_SubDEdge::ClearSavedSubdivisionPoints(this_00,true);
      uVar2 = uVar2 + 1;
    }
    this_00 = ON_SubDEdgeIterator::NextEdge(&eit);
  }
  if (uVar2 != 0) {
    ChangeGeometryContentSerialNumberForExperts(this,true);
  }
  ON_SubDRef::~ON_SubDRef(&eit.m_subd_ref);
  return uVar2;
}

Assistant:

unsigned int ON_SubD::ClearEdgeSharpness()
{
  unsigned int sharp_edge_count = 0;
  ON_SubDEdgeIterator eit = this->EdgeIterator();
  for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
  {
    if (const_cast<ON_SubDEdge*>(e)->ClearSharpnessForExperts())
    {
      e->ClearSavedSubdivisionPoints(true);
      ++sharp_edge_count;
    }
  }
  
  if (sharp_edge_count != 0)
    this->ChangeGeometryContentSerialNumberForExperts(true);

  return sharp_edge_count;
}